

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithMetaballs(PixelBufferAccess *dst,int numBalls,deUint32 seed)

{
  allocator<tcu::Vector<float,_2>_> *this;
  float fVar1;
  bool bVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  InternalError *this_00;
  reference pvVar6;
  reference b;
  float *pfVar7;
  float fVar8;
  float fVar9;
  Vector<float,_4> local_c0;
  Vector<float,_2> *local_b0;
  float local_a4;
  float f;
  Vec2 d;
  __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
  local_90;
  __normal_iterator<const_tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
  local_88;
  const_iterator i_1;
  float sum;
  Vec2 p;
  int x_1;
  int y_1;
  float local_60;
  float local_5c;
  float y;
  float x;
  int i;
  Random rnd;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> points;
  deUint32 seed_local;
  int numBalls_local;
  PixelBufferAccess *dst_local;
  
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    iVar4 = ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
    if (iVar4 != 1) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      this = (allocator<tcu::Vector<float,_2>_> *)((long)&rnd.m_rnd.z + 3);
      std::allocator<tcu::Vector<float,_2>_>::allocator(this);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                 &rnd.m_rnd.w,(long)numBalls,this);
      std::allocator<tcu::Vector<float,_2>_>::~allocator
                ((allocator<tcu::Vector<float,_2>_> *)((long)&rnd.m_rnd.z + 3));
      de::Random::Random((Random *)&x,seed);
      for (y = 0.0; (int)y < numBalls; y = (float)((int)y + 1)) {
        local_5c = de::Random::getFloat((Random *)&x);
        local_60 = de::Random::getFloat((Random *)&x);
        Vector<float,_2>::Vector((Vector<float,_2> *)&x_1,local_5c,local_60);
        pvVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&rnd.m_rnd.w,(long)(int)y);
        *&pvVar6->m_data = _x_1;
      }
      p.m_data[1] = 0.0;
      while( true ) {
        fVar8 = p.m_data[1];
        iVar4 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
        if (iVar4 <= (int)fVar8) break;
        p.m_data[0] = 0.0;
        while( true ) {
          fVar8 = p.m_data[0];
          iVar4 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
          if (iVar4 <= (int)fVar8) break;
          fVar8 = (float)(int)p.m_data[0];
          iVar4 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
          fVar9 = (float)(int)p.m_data[1];
          iVar5 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
          Vector<float,_2>::Vector
                    ((Vector<float,_2> *)&stack0xffffffffffffff88,fVar8 / (float)iVar4,
                     fVar9 / (float)iVar5);
          i_1._M_current._4_4_ = 0.0;
          local_90._M_current =
               (Vector<float,_2> *)
               std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::begin
                         ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &rnd.m_rnd.w);
          __gnu_cxx::
          __normal_iterator<tcu::Vector<float,2>const*,std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>>
          ::__normal_iterator<tcu::Vector<float,2>*>
                    ((__normal_iterator<tcu::Vector<float,2>const*,std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>>
                      *)&local_88,&local_90);
          while( true ) {
            d.m_data = (float  [2])
                       std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                       end((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
                           )&rnd.m_rnd.w);
            bVar2 = __gnu_cxx::operator!=
                              (&local_88,
                               (__normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
                                *)&d);
            if (!bVar2) break;
            b = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
                ::operator*(&local_88);
            operator-((tcu *)&stack0xffffffffffffff60,(Vector<float,_2> *)&stack0xffffffffffffff88,b
                     );
            pfVar7 = Vector<float,_2>::x((Vector<float,_2> *)&stack0xffffffffffffff60);
            fVar8 = *pfVar7;
            pfVar7 = Vector<float,_2>::x((Vector<float,_2> *)&stack0xffffffffffffff60);
            fVar9 = *pfVar7;
            pfVar7 = Vector<float,_2>::y((Vector<float,_2> *)&stack0xffffffffffffff60);
            fVar1 = *pfVar7;
            pfVar7 = Vector<float,_2>::y((Vector<float,_2> *)&stack0xffffffffffffff60);
            local_a4 = 0.01 / (fVar8 * fVar9 + fVar1 * *pfVar7);
            i_1._M_current._4_4_ = local_a4 + i_1._M_current._4_4_;
            local_b0 = (Vector<float,_2> *)
                       __gnu_cxx::
                       __normal_iterator<const_tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
                       ::operator++(&local_88,0);
          }
          Vector<float,_4>::Vector(&local_c0,i_1._M_current._4_4_);
          PixelBufferAccess::setPixel(dst,&local_c0,(int)p.m_data[0],(int)p.m_data[1],0);
          p.m_data[0] = (float)((int)p.m_data[0] + 1);
        }
        p.m_data[1] = (float)((int)p.m_data[1] + 1);
      }
      de::Random::~Random((Random *)&x);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                 &rnd.m_rnd.w);
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this_00,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3d7);
  __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

void fillWithMetaballs (const PixelBufferAccess& dst, int numBalls, deUint32 seed)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	std::vector<Vec2>	points(numBalls);
	de::Random			rnd(seed);

	for (int i = 0; i < numBalls; i++)
	{
		float x = rnd.getFloat();
		float y = rnd.getFloat();
		points[i] = (Vec2(x, y));
	}

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		Vec2 p((float)x/(float)dst.getWidth(), (float)y/(float)dst.getHeight());

		float sum = 0.0f;
		for (std::vector<Vec2>::const_iterator i = points.begin(); i != points.end(); i++)
		{
			Vec2	d = p - *i;
			float	f = 0.01f / (d.x()*d.x() + d.y()*d.y());

			sum += f;
		}

		dst.setPixel(Vec4(sum), x, y);
	}
}